

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O0

int firstNamelessRecord(int m,int firstcode)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int local_14;
  int codexm;
  int i;
  int firstcode_local;
  int m_local;
  
  iVar1 = coDex(m);
  local_14 = m;
  while( true ) {
    bVar3 = false;
    if (firstcode <= local_14) {
      iVar2 = coDex(local_14);
      bVar3 = false;
      if (iVar2 == iVar1) {
        bVar3 = (TERRITORY_BOUNDARIES[local_14].flags & 0x40U) != 0;
      }
    }
    if (!bVar3) break;
    local_14 = local_14 + -1;
  }
  return local_14 + 1;
}

Assistant:

static int firstNamelessRecord(const int m, const int firstcode) {
    int i = m;
    const int codexm = coDex(m);
    ASSERT((0 <= m) && (m <= MAPCODE_BOUNDARY_MAX));
    ASSERT((0 <= firstcode) && (firstcode <= MAPCODE_BOUNDARY_MAX));
    while (i >= firstcode && coDex(i) == codexm && IS_NAMELESS(i)) {
        i--;
    }
    return (i + 1);
}